

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestSingle_AsDiyFp(void)

{
  int in_R9D;
  DiyFp DVar1;
  Single local_24;
  Single local_20;
  Single local_1c;
  
  local_1c.d32_ = 0x1234567;
  DVar1 = double_conversion::Single::AsDiyFp(&local_1c);
  CheckEqualsHelper((char *)0x59,0xc1c2be,(char *)0xffffff6c,0xc1c1f6,(char *)(ulong)(uint)DVar1.e_,
                    in_R9D);
  CheckEqualsHelper((char *)0x5b,0xc1c2ce,"079672773",0xc1ce04,(char *)(DVar1.f_ & 0xffffffff),
                    in_R9D);
  local_20.d32_ = 1;
  DVar1 = double_conversion::Single::AsDiyFp(&local_20);
  CheckEqualsHelper((char *)0x5f,0xc1c2d7,(char *)0xffffff6b,0xc1c1f6,(char *)(ulong)(uint)DVar1.e_,
                    in_R9D);
  CheckEqualsHelper((char *)0x61,0xc1c254,(char *)0x1,0xc1ce04,(char *)(DVar1.f_ & 0xffffffff),
                    in_R9D);
  local_24.d32_ = 0x7f7fffff;
  DVar1 = double_conversion::Single::AsDiyFp(&local_24);
  CheckEqualsHelper((char *)0x65,0xc1c2e6,(char *)0x68,0xc1c1f6,(char *)(ulong)(uint)DVar1.e_,in_R9D
                   );
  CheckEqualsHelper((char *)0x66,0xc1c2f7,"",0xc1ce04,(char *)(DVar1.f_ & 0xffffffff),in_R9D);
  return;
}

Assistant:

TEST(Single_AsDiyFp) {
  uint32_t ordered = 0x01234567;
  DiyFp diy_fp = Single(ordered).AsDiyFp();
  CHECK_EQ(0x2 - 0x7F - 23, diy_fp.e());
  // The 23 mantissa bits, plus the implicit 1 in bit 24 as a uint32_t.
  CHECK_EQ(0xA34567, diy_fp.f());

  uint32_t min_float32 = 0x00000001;
  diy_fp = Single(min_float32).AsDiyFp();
  CHECK_EQ(-0x7F - 23 + 1, diy_fp.e());
  // This is a denormal; so no hidden bit.
  CHECK_EQ(1, diy_fp.f());

  uint32_t max_float32 = 0x7f7fffff;
  diy_fp = Single(max_float32).AsDiyFp();
  CHECK_EQ(0xFE - 0x7F - 23, diy_fp.e());
  CHECK_EQ(0x00ffffff, diy_fp.f());
}